

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_search.cpp
# Opt level: O2

int main(void)

{
  uint64_t uVar1;
  initializer_list<long> __l;
  allocator_type local_51;
  _Vector_base<long,_std::allocator<long>_> local_50;
  long local_38 [5];
  
  local_38[2] = 3;
  local_38[3] = 4;
  local_38[0] = 1;
  local_38[1] = 2;
  local_38[4] = 5;
  __l._M_len = 5;
  __l._M_array = local_38;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&local_50,__l,&local_51);
  uVar1 = binarySearch((vector<long,_std::allocator<long>_> *)&local_50,2);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_50);
  return (int)uVar1;
}

Assistant:

int main()
{
  return binarySearch(std::vector<int64_t>{1,2,3,4,5}, 2);
}